

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack4to1.h
# Opt level: O0

void ncnn::deconvolution_pack4to1_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float *pfVar3;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar4;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _w;
  __m128 _val;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  float sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  __m128 x32;
  __m128 x64;
  float local_66c;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  int local_5ac;
  undefined8 *local_5a8;
  int local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined4 local_570;
  long local_568;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined8 local_548;
  int local_53c;
  undefined8 local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined4 local_520;
  long local_518;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 local_500;
  undefined8 local_4f8;
  long local_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  float local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  long local_488;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  undefined8 local_468;
  float *local_460;
  int local_454;
  long local_450;
  int local_444;
  int local_440;
  int local_43c;
  int local_438;
  int local_434;
  long *local_428;
  long *local_420;
  long *local_418;
  undefined1 local_40d;
  int local_40c;
  undefined8 *local_400;
  undefined8 *local_3f0;
  undefined8 *local_3e0;
  undefined8 *local_3d0;
  undefined8 *local_3c0;
  undefined8 *local_3a0;
  undefined8 *local_380;
  undefined8 *local_360;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined1 local_315;
  int local_314;
  undefined8 *local_308;
  undefined1 local_2e5;
  int local_2e4;
  undefined8 *local_2d8;
  int local_2b4;
  undefined8 *local_2b0;
  float local_2a4;
  float local_2a0;
  float local_29c;
  float local_298;
  float local_294;
  float local_290;
  float local_28c;
  float local_288;
  float local_284;
  long *local_280;
  float local_274 [3];
  long *local_268;
  undefined8 local_260;
  long *local_258;
  undefined8 local_250;
  long *local_248;
  undefined8 local_240;
  long *local_238;
  undefined8 local_230;
  long *local_228;
  long local_220;
  undefined4 local_214;
  long local_210;
  long local_208;
  undefined4 local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  long local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 *local_1b8;
  long local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  float *local_198;
  undefined4 local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  undefined4 local_174;
  long local_170;
  undefined4 local_164;
  long local_160;
  undefined4 local_154;
  long local_150;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_43c = (int)in_RSI[7];
  local_440 = in_stack_00000008 * (in_R8D + -1) + 1;
  local_444 = in_stack_00000010 * (in_R9D + -1) + 1;
  local_450 = *in_RCX;
  local_438 = in_R9D;
  local_434 = in_R8D;
  local_428 = in_RDX;
  local_420 = in_RSI;
  local_418 = in_RDI;
  for (local_454 = 0; local_454 < local_43c; local_454 = local_454 + 1) {
    local_400 = &local_4a8;
    local_184 = *(int *)((long)local_420 + 0x2c);
    local_188 = (int)local_420[6];
    local_18c = *(undefined4 *)((long)local_420 + 0x34);
    local_460 = (float *)(*local_420 + local_420[8] * (long)local_454 * local_420[2]);
    local_1a0 = local_420[2];
    local_1a4 = (undefined4)local_420[3];
    local_1b0 = local_420[4];
    local_180 = &local_4a8;
    local_170 = (long)local_184 * (long)local_188 * local_1a0;
    local_3c0 = &local_4a8;
    local_3f0 = &local_4a8;
    local_174 = 0x10;
    local_40c = local_454;
    local_40d = 1;
    local_4a8 = 0;
    local_498 = 0;
    local_490 = 0;
    local_480 = 0;
    local_47c = 0;
    local_478 = 0;
    local_474 = 0;
    local_470 = 0;
    local_468 = 0;
    local_4a0 = 0;
    local_4b8 = local_434 * local_438;
    local_4bc = *(int *)((long)local_418 + 0x2c);
    local_4c0 = (int)local_418[6];
    local_4c4 = (int)local_418[7];
    local_4c8 = *(int *)((long)local_420 + 0x2c);
    local_4cc = (int)local_420[6];
    local_360 = local_3f0;
    local_198 = local_460;
    local_488 = local_1b0;
    for (local_4d0 = 0; local_4d0 < local_4cc; local_4d0 = local_4d0 + 1) {
      for (local_4d4 = 0; local_4d4 < local_4c8; local_4d4 = local_4d4 + 1) {
        local_4d8 = 0.0;
        if (local_450 != 0) {
          local_4d8 = *(float *)(local_450 + (long)local_454 * 4);
        }
        local_2d8 = &local_538;
        local_1f4 = *(int *)((long)local_428 + 0x2c);
        local_1f8 = (int)local_428[6];
        local_1fc = *(undefined4 *)((long)local_428 + 0x34);
        local_208 = *local_428 + local_428[8] * (long)local_454 * local_428[2];
        local_210 = local_428[2];
        local_214 = (undefined4)local_428[3];
        local_220 = local_428[4];
        local_1f0 = &local_538;
        local_150 = (long)local_1f4 * (long)local_1f8 * local_210;
        local_328 = &local_538;
        local_3e0 = &local_538;
        local_154 = 0x10;
        local_2e4 = local_454;
        local_2e5 = 1;
        uStack_340 = 0;
        local_348 = 0;
        uStack_4e0 = 0;
        local_4e8 = 0;
        local_538 = 0;
        local_528 = 0;
        local_520 = 0;
        local_510 = 0;
        local_50c = 0;
        local_508 = 0;
        local_504 = 0;
        local_500 = 0;
        local_4f8 = 0;
        local_530 = 0;
        local_4f0 = local_208;
        for (local_53c = 0; local_53c < local_4c4; local_53c = local_53c + 1) {
          local_308 = &local_588;
          local_1bc = *(int *)((long)local_418 + 0x2c);
          local_1c0 = (int)local_418[6];
          local_1c4 = *(undefined4 *)((long)local_418 + 0x34);
          local_1d0 = *local_418 + local_418[8] * (long)local_53c * local_418[2];
          local_1d8 = local_418[2];
          local_1dc = (undefined4)local_418[3];
          local_1e8 = local_418[4];
          local_1b8 = &local_588;
          local_160 = (long)local_1bc * (long)local_1c0 * local_1d8;
          for (local_58c = 0; local_58c < local_438; local_58c = local_58c + 1) {
            local_590 = (local_4d0 + local_58c * in_stack_00000010) - (local_444 + -1);
            if (((-1 < local_590) && (local_590 % in_stack_00000020 == 0)) &&
               (local_594 = local_590 / in_stack_00000020, local_594 < local_4c0)) {
              for (local_598 = 0; local_598 < local_434; local_598 = local_598 + 1) {
                local_59c = (local_4d4 + local_598 * in_stack_00000008) - (local_440 + -1);
                if (((-1 < local_59c) && (local_59c % in_stack_00000018 == 0)) &&
                   (local_5a0 = local_59c / in_stack_00000018, local_5a0 < local_4bc)) {
                  local_2b0 = &local_588;
                  local_5a8 = (undefined8 *)
                              (local_1d0 + (long)local_1bc * (long)local_594 * local_1d8 +
                              (long)(local_5a0 << 2) * 4);
                  local_5ac = local_58c * local_434 + local_598;
                  local_5c8 = *local_5a8;
                  uStack_5c0 = local_5a8[1];
                  local_338 = (undefined8 *)(local_4f0 + (long)(local_5ac * 4) * 4);
                  local_5d8 = *local_338;
                  uStack_5d0 = local_338[1];
                  local_f0 = &local_5c8;
                  local_f8 = &local_5d8;
                  local_100 = &local_4e8;
                  local_b8._0_4_ = (float)local_5c8;
                  local_b8._4_4_ = (float)((ulong)local_5c8 >> 0x20);
                  uStack_b0._0_4_ = (float)uStack_5c0;
                  uStack_b0._4_4_ = (float)((ulong)uStack_5c0 >> 0x20);
                  local_c8._0_4_ = (float)local_5d8;
                  local_c8._4_4_ = (float)((ulong)local_5d8 >> 0x20);
                  uStack_c0._0_4_ = (float)uStack_5d0;
                  uStack_c0._4_4_ = (float)((ulong)uStack_5d0 >> 0x20);
                  local_d8 = (float)local_b8 * (float)local_c8;
                  fStack_d4 = local_b8._4_4_ * local_c8._4_4_;
                  fStack_d0 = (float)uStack_b0 * (float)uStack_c0;
                  fStack_cc = uStack_b0._4_4_ * uStack_c0._4_4_;
                  uVar1 = local_4e8;
                  uVar2 = uStack_4e0;
                  local_e8._0_4_ = (float)local_4e8;
                  local_e8._4_4_ = (float)((ulong)local_4e8 >> 0x20);
                  uStack_e0._0_4_ = (float)uStack_4e0;
                  uStack_e0._4_4_ = (float)((ulong)uStack_4e0 >> 0x20);
                  local_4e8 = CONCAT44(fStack_d4 + local_e8._4_4_,local_d8 + (float)local_e8);
                  uStack_4e0 = CONCAT44(fStack_cc + uStack_e0._4_4_,fStack_d0 + (float)uStack_e0);
                  local_330 = local_5a8;
                  local_2b4 = local_594;
                  local_e8 = uVar1;
                  uStack_e0 = uVar2;
                  local_c8 = local_5d8;
                  uStack_c0 = uStack_5d0;
                  local_b8 = local_5c8;
                  uStack_b0 = uStack_5c0;
                }
              }
            }
          }
          local_4f0 = local_4f0 + (long)(local_4b8 << 2) * 4;
          local_3d0 = &local_588;
          local_164 = 0x10;
          local_314 = local_53c;
          local_315 = 1;
          local_588 = 0;
          local_578 = 0;
          local_570 = 0;
          local_560 = 0;
          local_55c = 0;
          local_558 = 0;
          local_554 = 0;
          local_550 = 0;
          local_548 = 0;
          local_580 = 0;
          local_3a0 = local_3d0;
          local_568 = local_1e8;
        }
        local_88 = local_4e8;
        uStack_80 = uStack_4e0;
        local_48 = local_4e8;
        uStack_40 = uStack_4e0;
        local_58 = local_4e8;
        uStack_50 = uStack_4e0;
        local_68 = local_4e8;
        uVar1 = local_68;
        uStack_60 = uStack_4e0;
        uVar2 = uStack_60;
        local_78 = uStack_4e0;
        uStack_70 = uStack_4e0;
        local_68._0_4_ = (float)local_4e8;
        local_68._4_4_ = (float)((ulong)local_4e8 >> 0x20);
        uStack_60._0_4_ = (float)uStack_4e0;
        uStack_60._4_4_ = (float)((ulong)uStack_4e0 >> 0x20);
        local_98 = (float)local_68 + (float)uStack_60;
        fStack_94 = local_68._4_4_ + uStack_60._4_4_;
        fStack_90 = (float)uStack_60 + (float)uStack_60;
        fStack_8c = uStack_60._4_4_ + uStack_60._4_4_;
        local_28 = local_98 + fStack_94;
        local_a8 = CONCAT44(fStack_94,local_28);
        uStack_a0 = CONCAT44(fStack_8c,fStack_90);
        local_66c = local_4d8 + local_28;
        local_280 = in_stack_00000030;
        local_274[0] = local_66c;
        local_4d8 = local_66c;
        local_380 = local_3e0;
        local_68 = uVar1;
        uStack_60 = uVar2;
        local_38 = fStack_94;
        fStack_34 = fStack_94;
        fStack_30 = fStack_94;
        fStack_2c = fStack_94;
        fStack_24 = fStack_94;
        fStack_20 = fStack_90;
        fStack_1c = fStack_8c;
        local_18 = local_a8;
        uStack_10 = uStack_a0;
        local_518 = local_220;
        switch(in_stack_00000028) {
        case 1:
          if (local_66c <= 0.0) {
            local_274[0] = 0.0;
          }
          break;
        case 2:
          local_228 = in_stack_00000030;
          local_230 = 0;
          local_284 = *(float *)*in_stack_00000030;
          if (local_66c <= 0.0) {
            local_66c = local_66c * local_284;
          }
          local_274[0] = local_66c;
          break;
        case 3:
          local_238 = in_stack_00000030;
          local_240 = 0;
          local_288 = *(float *)*in_stack_00000030;
          local_248 = in_stack_00000030;
          local_250 = 1;
          local_28c = *(float *)(*in_stack_00000030 + 4);
          if (local_66c < local_288) {
            local_274[0] = local_288;
          }
          if (local_28c < local_274[0]) {
            local_274[0] = local_28c;
          }
          break;
        case 4:
          local_290 = 88.37626;
          pfVar3 = std::min<float>(local_274,&local_290);
          local_274[0] = *pfVar3;
          local_294 = -88.37626;
          pfVar3 = std::max<float>(local_274,&local_294);
          local_274[0] = *pfVar3;
          fVar4 = expf(-local_274[0]);
          local_274[0] = 1.0 / (fVar4 + 1.0);
          break;
        case 5:
          fVar4 = expf(local_66c);
          fVar4 = logf(fVar4 + 1.0);
          local_274[0] = tanhf(fVar4);
          local_274[0] = local_66c * local_274[0];
          break;
        case 6:
          local_258 = in_stack_00000030;
          local_260 = 0;
          local_298 = *(float *)*in_stack_00000030;
          local_268 = in_stack_00000030;
          local_274[1] = 1.4013e-45;
          local_274[2] = 0.0;
          local_29c = *(float *)(*in_stack_00000030 + 4);
          local_2a0 = -local_29c / local_298;
          local_2a4 = 1.0 / local_298 + local_2a0;
          if (local_2a0 <= local_66c) {
            if (local_66c <= local_2a4) {
              local_274[0] = local_66c * (local_66c * local_298 + local_29c);
            }
          }
          else {
            local_274[0] = 0.0;
          }
        }
        *local_460 = local_274[0];
        local_460 = local_460 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack4to1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_data_ptr)
                {
                    sum = bias_data_ptr[p];
                }

                __m128 _sum = _mm_setzero_ps();

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 4;

                            int k = y * kernel_w + x;

                            __m128 _val = _mm_load_ps(sptr);
                            __m128 _w = _mm_load_ps(kptr + k * 4);
                            _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 4;
                }

                sum += _mm_reduce_add_ps(_sum);

                sum = activation_ss(sum, activation_type, activation_params);

                outptr[0] = sum;
                outptr++;
            }
        }
    }
}